

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

ErrorStatus ts_parser__version_status(TSParser *self,StackVersion version)

{
  ErrorStatus EVar1;
  _Bool _Var2;
  TSStateId TVar3;
  uint uVar4;
  int iVar5;
  bool local_2a;
  uint local_28;
  _Bool is_paused;
  uint cost;
  StackVersion version_local;
  TSParser *self_local;
  undefined4 uStack_c;
  
  local_28 = ts_stack_error_cost(self->stack,version);
  _Var2 = ts_stack_is_paused(self->stack,version);
  if (_Var2) {
    local_28 = local_28 + 100;
  }
  uVar4 = ts_stack_node_count_since_error(self->stack,version);
  iVar5 = ts_stack_dynamic_precedence(self->stack,version);
  local_2a = true;
  if (!_Var2) {
    TVar3 = ts_stack_state(self->stack,version);
    local_2a = TVar3 == 0;
  }
  uStack_c._0_1_ = local_2a;
  EVar1.node_count = uVar4;
  EVar1.cost = local_28;
  EVar1.dynamic_precedence = iVar5;
  EVar1._12_4_ = uStack_c;
  return EVar1;
}

Assistant:

static ErrorStatus ts_parser__version_status(TSParser *self, StackVersion version) {
  unsigned cost = ts_stack_error_cost(self->stack, version);
  bool is_paused = ts_stack_is_paused(self->stack, version);
  if (is_paused) cost += ERROR_COST_PER_SKIPPED_TREE;
  return (ErrorStatus) {
    .cost = cost,
    .node_count = ts_stack_node_count_since_error(self->stack, version),
    .dynamic_precedence = ts_stack_dynamic_precedence(self->stack, version),
    .is_in_error = is_paused || ts_stack_state(self->stack, version) == ERROR_STATE
  };
}